

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_profile_params(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"block");
    *(wchar_t *)((long)pvVar3 + 0x18) = wVar1;
    wVar1 = parser_getint(p,"rooms");
    *(wchar_t *)((long)pvVar3 + 0x1c) = wVar1;
    wVar1 = parser_getint(p,"unusual");
    *(wchar_t *)((long)pvVar3 + 0x20) = wVar1;
    wVar1 = parser_getint(p,"rarity");
    *(wchar_t *)((long)pvVar3 + 0x24) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_profile_params(struct parser *p) {
	struct cave_profile *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->block_size = parser_getint(p, "block");
	c->dun_rooms = parser_getint(p, "rooms");
	c->dun_unusual = parser_getint(p, "unusual");
	c->max_rarity = parser_getint(p, "rarity");
	return PARSE_ERROR_NONE;
}